

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complextype.cpp
# Opt level: O0

Token * __thiscall
ComplexType::parseNumber
          (Token *__return_storage_ptr__,ComplexType *this,string *str,char *current,size_t *index)

{
  ulong uVar1;
  initializer_list<NumericConstantChar> __l;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  runtime_error *this_00;
  NumericConstant local_d8;
  NumericConstantChar local_b2;
  value_type local_b1;
  ulong local_b0;
  size_t next;
  bool hasDecimalPoint;
  iterator pNStack_a0;
  size_type local_98;
  undefined1 local_90 [8];
  NumericChars chars;
  NumericConstantChar local_61;
  initializer_list<NumericConstantChar> local_60;
  NumericConstant local_50;
  size_t *local_30;
  size_t *index_local;
  char *current_local;
  string *str_local;
  ComplexType *this_local;
  
  local_30 = index;
  index_local = (size_t *)current;
  current_local = (char *)str;
  str_local = (string *)this;
  this_local = (ComplexType *)__return_storage_ptr__;
  if (*current == 'i') {
    local_61 = ImaginaryUnit;
    local_60._M_array = &local_61;
    local_60._M_len = 1;
    NumericConstant::NumericConstant(&local_50,&local_60);
    Token::Token(__return_storage_ptr__,&local_50);
    NumericConstant::~NumericConstant(&local_50);
  }
  else {
    next._7_1_ = NumericConstantChars::getChar(*current);
    pNStack_a0 = (iterator)((long)&next + 7);
    local_98 = 1;
    std::allocator<NumericConstantChar>::allocator
              ((allocator<NumericConstantChar> *)((long)&next + 6));
    __l._M_len = local_98;
    __l._M_array = pNStack_a0;
    std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::vector
              ((vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)local_90,__l,
               (allocator<NumericConstantChar> *)((long)&next + 6));
    std::allocator<NumericConstantChar>::~allocator
              ((allocator<NumericConstantChar> *)((long)&next + 6));
    next._5_1_ = 0;
    while( true ) {
      uVar1 = *local_30;
      local_b0 = uVar1 + 1;
      uVar3 = std::__cxx11::string::size();
      if (uVar3 <= uVar1 + 1) break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)current_local);
      iVar2 = tolower((int)*pcVar4);
      *(char *)index_local = (char)iVar2;
      if ((char)*index_local == '.') {
        if ((next._5_1_ & 1) != 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"The token already contains a decimal point.");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        next._5_1_ = 1;
      }
      else {
        if ((char)*index_local == 'i') {
          *local_30 = local_b0;
          local_b1 = ImaginaryUnit;
          std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::push_back
                    ((vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)local_90,
                     &local_b1);
          break;
        }
        iVar2 = isdigit((int)(char)*index_local);
        if (iVar2 == 0) break;
      }
      local_b2 = NumericConstantChars::getChar((char)*index_local);
      std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::push_back
                ((vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)local_90,
                 &local_b2);
      *local_30 = local_b0;
    }
    NumericConstant::NumericConstant
              (&local_d8,
               (vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)local_90);
    Token::Token(__return_storage_ptr__,&local_d8);
    NumericConstant::~NumericConstant(&local_d8);
    std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::~vector
              ((vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Token ComplexType::parseNumber(std::string& str, char& current, std::size_t& index) const {
	if (current == 'i') {
		return NumericConstant({ NumericConstantChar::ImaginaryUnit });
	}

	NumericChars chars({ NumericConstantChars::getChar(current) });
	bool hasDecimalPoint = false;

	while (true) {
		std::size_t next = index + 1;

		if (next >= str.size()) {
			break;
		}

		current = (char)std::tolower(str[next]);

		if (current == '.') {
			if (!hasDecimalPoint) {
				hasDecimalPoint = true;
			} else {
				throw std::runtime_error("The token already contains a decimal point.");
			}
		} else if (current == 'i') {
			index = next;
			chars.push_back(NumericConstantChar::ImaginaryUnit);
			break;
		} else {
			if (!isdigit(current)) {
				break;
			}
		}

		chars.push_back(NumericConstantChars::getChar(current));
		index = next;
	}

	return NumericConstant(chars);
}